

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_metadata_test.cpp
# Opt level: O0

int function_example_interface_create(function func,function_impl impl)

{
  function_impl_example example_impl;
  function_impl impl_local;
  function func_local;
  uint local_4;
  
  if (impl != (function_impl)0x0) {
    *(code **)impl = function_example;
  }
  local_4 = (uint)(impl == (function_impl)0x0);
  return local_4;
}

Assistant:

int function_example_interface_create(function func, function_impl impl)
{
	function_impl_example example_impl = (function_impl_example)impl;

	(void)func;

	if (example_impl != NULL)
	{
		example_impl->ptr = &function_example;

		return 0;
	}

	return 1;
}